

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalBatchCopyToFile::GetGlobalSinkState
          (PhysicalBatchCopyToFile *this,ClientContext *context)

{
  code *pcVar1;
  const_reference pvVar2;
  pointer pFVar3;
  idx_t iVar4;
  ClientContext *in_RDX;
  _Head_base<0UL,_duckdb::FixedBatchCopyGlobalState_*,_false> local_30;
  unsigned_long minimum_memory_per_thread;
  
  pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)&context->db
                      ,0);
  minimum_memory_per_thread =
       ((long)(pvVar2->_M_data->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)(pvVar2->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start) / 0x18 << 0x16;
  make_uniq<duckdb::FixedBatchCopyGlobalState,duckdb::ClientContext&,unsigned_long&>
            ((duckdb *)&local_30,in_RDX,&minimum_memory_per_thread);
  if (context[1].config.field_0x92 == '\x01') {
    pFVar3 = unique_ptr<duckdb::FixedBatchCopyGlobalState,_std::default_delete<duckdb::FixedBatchCopyGlobalState>,_true>
             ::operator->((unique_ptr<duckdb::FixedBatchCopyGlobalState,_std::default_delete<duckdb::FixedBatchCopyGlobalState>,_true>
                           *)&local_30);
    FixedBatchCopyGlobalState::Initialize(pFVar3,in_RDX,(PhysicalBatchCopyToFile *)context);
  }
  pcVar1 = (code *)(context->config).streaming_buffer_size;
  if (pcVar1 == (code *)0x0) {
    iVar4 = 0;
  }
  else {
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator*
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               &context[1].config.profiler_settings._M_h._M_rehash_policy);
    iVar4 = (*pcVar1)();
  }
  pFVar3 = unique_ptr<duckdb::FixedBatchCopyGlobalState,_std::default_delete<duckdb::FixedBatchCopyGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::FixedBatchCopyGlobalState,_std::default_delete<duckdb::FixedBatchCopyGlobalState>,_true>
                         *)&local_30);
  pFVar3->batch_size = iVar4;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalBatchCopyToFile::GetGlobalSinkState(ClientContext &context) const {
	// request memory based on the minimum amount of memory per column
	auto minimum_memory_per_thread =
	    FixedBatchCopyGlobalState::MINIMUM_MEMORY_PER_COLUMN_PER_THREAD * children[0].get().GetTypes().size();
	auto result = make_uniq<FixedBatchCopyGlobalState>(context, minimum_memory_per_thread);
	if (write_empty_file) {
		// if we are writing the file also if it is empty - initialize now
		result->Initialize(context, *this);
	}
	result->batch_size = function.desired_batch_size ? function.desired_batch_size(context, *bind_data) : 0;
	return std::move(result);
}